

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HFactorDebug.cpp
# Opt level: O0

void debugReportRankDeficiency
               (HighsInt call_id,HighsInt highs_debug_level,HighsLogOptions *log_options,
               HighsInt num_row,vector<int,_std::allocator<int>_> *permute,
               vector<int,_std::allocator<int>_> *iwork,HighsInt *basic_index,
               HighsInt rank_deficiency,vector<int,_std::allocator<int>_> *row_with_no_pivot,
               vector<int,_std::allocator<int>_> *col_with_no_pivot)

{
  uint *puVar1;
  int in_ECX;
  HighsLogOptions *in_RDX;
  int in_ESI;
  int in_EDI;
  vector<int,_std::allocator<int>_> *in_R8;
  vector<int,_std::allocator<int>_> *in_R9;
  long in_stack_00000008;
  int in_stack_00000010;
  vector<int,_std::allocator<int>_> *in_stack_00000018;
  vector<int,_std::allocator<int>_> *in_stack_00000020;
  HighsInt i_10;
  HighsInt i_9;
  HighsInt i_8;
  HighsInt i_7;
  HighsInt i_6;
  HighsInt i_5;
  HighsInt i_4;
  HighsInt i_3;
  HighsInt i_2;
  HighsInt i_1;
  HighsInt i;
  int local_54;
  uint local_50;
  int local_4c;
  uint local_48;
  int local_44;
  int local_40;
  uint local_3c;
  int local_38;
  int local_34;
  int local_30;
  uint local_2c;
  
  if (in_ESI != 0) {
    if (in_EDI == 0) {
      if (in_ECX < 0x7c) {
        highsLogDev(in_RDX,kWarning,"buildRankDeficiency0:");
        highsLogDev(in_RDX,kWarning,"\nIndex  ");
        for (local_2c = 0; (int)local_2c < in_ECX; local_2c = local_2c + 1) {
          highsLogDev(in_RDX,kWarning," %2d",(ulong)local_2c);
        }
        highsLogDev(in_RDX,kWarning,"\nPerm   ");
        for (local_30 = 0; local_30 < in_ECX; local_30 = local_30 + 1) {
          puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_30);
          highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
        }
        highsLogDev(in_RDX,kWarning,"\nIwork  ");
        for (local_34 = 0; local_34 < in_ECX; local_34 = local_34 + 1) {
          puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R9,(long)local_34);
          highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
        }
        highsLogDev(in_RDX,kWarning,"\nBaseI  ");
        for (local_38 = 0; local_38 < in_ECX; local_38 = local_38 + 1) {
          highsLogDev(in_RDX,kWarning," %2d",
                      (ulong)*(uint *)(in_stack_00000008 + (long)local_38 * 4));
        }
        highsLogDev(in_RDX,kWarning,"\n");
      }
    }
    else if (in_EDI == 1) {
      if (in_stack_00000010 < 0x65) {
        highsLogDev(in_RDX,kWarning,"buildRankDeficiency1:");
        highsLogDev(in_RDX,kWarning,"\nIndex  ");
        for (local_3c = 0; (int)local_3c < in_stack_00000010; local_3c = local_3c + 1) {
          highsLogDev(in_RDX,kWarning," %2d",(ulong)local_3c);
        }
        highsLogDev(in_RDX,kWarning,"\nrow_with_no_pivot  ");
        for (local_40 = 0; local_40 < in_stack_00000010; local_40 = local_40 + 1) {
          puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_stack_00000018,(long)local_40);
          highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
        }
        highsLogDev(in_RDX,kWarning,"\ncol_with_no_pivot  ");
        for (local_44 = 0; local_44 < in_stack_00000010; local_44 = local_44 + 1) {
          puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                     (in_stack_00000020,(long)local_44);
          highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
        }
        highsLogDev(in_RDX,kWarning,"\n");
        if (in_ECX < 0x7c) {
          highsLogDev(in_RDX,kWarning,"Index  ");
          for (local_48 = 0; (int)local_48 < in_ECX; local_48 = local_48 + 1) {
            highsLogDev(in_RDX,kWarning," %2d",(ulong)local_48);
          }
          highsLogDev(in_RDX,kWarning,"\nIwork  ");
          for (local_4c = 0; local_4c < in_ECX; local_4c = local_4c + 1) {
            puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                                       (in_R9,(long)local_4c);
            highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
          }
          highsLogDev(in_RDX,kWarning,"\n");
        }
      }
    }
    else if ((in_EDI == 2) && (in_ECX < 0x7c)) {
      highsLogDev(in_RDX,kWarning,"buildRankDeficiency2:");
      highsLogDev(in_RDX,kWarning,"\nIndex  ");
      for (local_50 = 0; (int)local_50 < in_ECX; local_50 = local_50 + 1) {
        highsLogDev(in_RDX,kWarning," %2d",(ulong)local_50);
      }
      highsLogDev(in_RDX,kWarning,"\nPerm   ");
      for (local_54 = 0; local_54 < in_ECX; local_54 = local_54 + 1) {
        puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](in_R8,(long)local_54);
        highsLogDev(in_RDX,kWarning," %2d",(ulong)*puVar1);
      }
      highsLogDev(in_RDX,kWarning,"\n");
    }
  }
  return;
}

Assistant:

void debugReportRankDeficiency(
    const HighsInt call_id, const HighsInt highs_debug_level,
    const HighsLogOptions& log_options, const HighsInt num_row,
    const vector<HighsInt>& permute, const vector<HighsInt>& iwork,
    const HighsInt* basic_index, const HighsInt rank_deficiency,
    const vector<HighsInt>& row_with_no_pivot,
    const vector<HighsInt>& col_with_no_pivot) {
  if (highs_debug_level == kHighsDebugLevelNone) return;
  if (call_id == 0) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency0:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\nBaseI  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  basic_index[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 1) {
    if (rank_deficiency > 100) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency1:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nrow_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  row_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\ncol_with_no_pivot  ");
    for (HighsInt i = 0; i < rank_deficiency; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  col_with_no_pivot[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "Index  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nIwork  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  iwork[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  } else if (call_id == 2) {
    if (num_row > 123) return;
    highsLogDev(log_options, HighsLogType::kWarning, "buildRankDeficiency2:");
    highsLogDev(log_options, HighsLogType::kWarning, "\nIndex  ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  i);
    highsLogDev(log_options, HighsLogType::kWarning, "\nPerm   ");
    for (HighsInt i = 0; i < num_row; i++)
      highsLogDev(log_options, HighsLogType::kWarning, " %2" HIGHSINT_FORMAT "",
                  permute[i]);
    highsLogDev(log_options, HighsLogType::kWarning, "\n");
  }
}